

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O1

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>,3,0>
       ::run<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                 (redux_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *eval,scalar_max_op<double,_double,_0> *func,
                 Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *xpr)

{
  PointerType pdVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  pdVar1 = (xpr->super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
           ).super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
           m_data;
  uVar2 = (xpr->super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>)
          .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>.
          m_rows.m_value;
  uVar4 = uVar2;
  if ((((ulong)pdVar1 & 7) == 0) &&
     (uVar4 = (ulong)((uint)((ulong)pdVar1 >> 3) & 1), (long)uVar2 <= (long)uVar4)) {
    uVar4 = uVar2;
  }
  uVar8 = uVar2 - uVar4;
  uVar7 = uVar8 + 3;
  if (-1 < (long)uVar8) {
    uVar7 = uVar8;
  }
  pdVar3 = (eval->
           super_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>).
           super_block_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>.
           super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_data;
  if (uVar8 + 1 < 3) {
    if ((long)uVar2 < 2) {
      return *pdVar3;
    }
    uVar4 = 1;
    dVar10 = *pdVar3;
    do {
      dVar11 = pdVar3[uVar4];
      if (pdVar3[uVar4] <= dVar10) {
        dVar11 = dVar10;
      }
      uVar4 = uVar4 + 1;
      dVar10 = dVar11;
    } while (uVar2 != uVar4);
  }
  else {
    uVar5 = uVar8 - ((long)uVar8 >> 0x3f) & 0xfffffffffffffffe;
    auVar12 = *(undefined1 (*) [16])(pdVar3 + uVar4);
    if (3 < (long)uVar8) {
      lVar6 = (uVar7 & 0xfffffffffffffffc) + uVar4;
      auVar13 = *(undefined1 (*) [16])(pdVar3 + uVar4 + 2);
      if (7 < (long)uVar8) {
        lVar9 = uVar4 + 4;
        do {
          auVar12 = maxpd(*(undefined1 (*) [16])(pdVar3 + lVar9),auVar12);
          auVar13 = maxpd(*(undefined1 (*) [16])(pdVar3 + lVar9 + 2),auVar13);
          lVar9 = lVar9 + 4;
        } while (lVar9 < lVar6);
      }
      auVar12 = maxpd(auVar13,auVar12);
      if ((long)(uVar7 & 0xfffffffffffffffc) < (long)uVar5) {
        auVar12 = maxpd(*(undefined1 (*) [16])(pdVar3 + lVar6),auVar12);
      }
    }
    lVar6 = uVar5 + uVar4;
    dVar10 = auVar12._8_8_;
    if (auVar12._8_8_ <= auVar12._0_8_) {
      dVar10 = auVar12._0_8_;
    }
    if (0 < (long)uVar4) {
      uVar7 = 0;
      dVar11 = dVar10;
      do {
        dVar10 = pdVar3[uVar7];
        if (pdVar3[uVar7] <= dVar11) {
          dVar10 = dVar11;
        }
        uVar7 = uVar7 + 1;
        dVar11 = dVar10;
      } while (uVar4 != uVar7);
    }
    if ((long)uVar2 <= lVar6) {
      return dVar10;
    }
    do {
      dVar11 = pdVar3[lVar6];
      if (pdVar3[lVar6] <= dVar10) {
        dVar11 = dVar10;
      }
      lVar6 = lVar6 + 1;
      dVar10 = dVar11;
    } while (lVar6 < (long)uVar2);
  }
  return dVar11;
}

Assistant:

EIGEN_DEVICE_FUNC
    inline const Scalar* data() const { return this->m_data; }